

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<void_*>::TPZVec(TPZVec<void_*> *this,TPZVec<void_*> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RSI;
  undefined8 *in_RDI;
  int64_t i;
  long local_18;
  
  *in_RDI = &PTR__TPZVec_023d3348;
  in_RDI[1] = 0;
  if (*(long *)(in_RSI + 0x10) < 1) {
    in_RDI[1] = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(in_RSI + 0x10);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    in_RDI[1] = pvVar3;
  }
  for (local_18 = 0; local_18 < *(long *)(in_RSI + 0x10); local_18 = local_18 + 1) {
    *(undefined8 *)(in_RDI[1] + local_18 * 8) =
         *(undefined8 *)(*(long *)(in_RSI + 8) + local_18 * 8);
  }
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}